

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewScopeLayer.cpp
# Opt level: O3

void __thiscall NewScopeLayer::NewScopeLayer(NewScopeLayer *this)

{
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"__GLOBAL__","");
  (this->class_symbol_).name_._M_dataplus._M_p = (pointer)0x0;
  (this->class_symbol_).name_._M_string_length = 0;
  (this->class_symbol_).name_.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->class_symbol_).name_.field_2 + 8) = 0;
  (this->children_).super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_).super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->parent_ = (NewScopeLayer *)0x0;
  (this->children_).super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->class_symbol_).name_._M_dataplus._M_p = (pointer)&(this->class_symbol_).name_.field_2;
  (this->class_symbol_).name_.field_2._M_local_buf[0] = '\0';
  (this->method_symbol_).name_.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->method_symbol_).name_.field_2 + 8) = 0;
  (this->method_symbol_).name_._M_dataplus._M_p = (pointer)&(this->method_symbol_).name_.field_2;
  (this->method_symbol_).name_._M_string_length = 0;
  this->traverse_index = 0;
  (this->variables_)._M_h._M_buckets = &(this->variables_)._M_h._M_single_bucket;
  (this->variables_)._M_h._M_bucket_count = 1;
  (this->variables_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variables_)._M_h._M_element_count = 0;
  (this->variables_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variables_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variables_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->arrays_)._M_h._M_buckets = &(this->arrays_)._M_h._M_single_bucket;
  (this->arrays_)._M_h._M_bucket_count = 1;
  (this->arrays_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->arrays_)._M_h._M_element_count = 0;
  (this->arrays_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->arrays_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->arrays_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->user_type_system_)._M_h._M_buckets = &(this->user_type_system_)._M_h._M_single_bucket;
  (this->user_type_system_)._M_h._M_bucket_count = 1;
  (this->user_type_system_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->user_type_system_)._M_h._M_element_count = 0;
  (this->user_type_system_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->user_type_system_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->user_type_system_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->symbol_types_)._M_h._M_buckets = &(this->symbol_types_)._M_h._M_single_bucket;
  (this->symbol_types_)._M_h._M_bucket_count = 1;
  (this->symbol_types_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbol_types_)._M_h._M_element_count = 0;
  (this->symbol_types_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbol_types_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbol_types_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

NewScopeLayer::NewScopeLayer()
    : parent_(nullptr),
      name_("__GLOBAL__"),
      class_symbol_(),
      method_symbol_(),
      traverse_index(0) {}